

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numbers.cc
# Opt level: O0

Nonnull<char_*> absl::numbers_internal::FastIntToBuffer(int64_t i,Nonnull<char_*> buffer)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint64_t uVar3;
  char *in_RSI;
  Nonnull<char_*> in_RDI;
  uint64_t u;
  uint64_t mod_result;
  uint64_t mid_result;
  uint32_t div08mod08;
  uint32_t div016;
  uint64_t div08_3;
  uint32_t div08_1;
  uint32_t mod08;
  uint64_t bottom_2;
  uint32_t mod08_2;
  uint32_t div08_2;
  uint32_t zeroes_1;
  uint64_t bottom_3;
  uint64_t bottom;
  uint32_t mod08_1;
  uint32_t div08;
  uint32_t zeroes;
  uint64_t bottom_1;
  uint64_t in_stack_ffffffffffffff28;
  Nonnull<char_*> p;
  Nonnull<char_*> out_str;
  char *pcVar4;
  undefined8 in_stack_ffffffffffffff50;
  uint32_t i_00;
  char *local_88;
  char *local_78;
  char *local_40;
  char *local_8;
  uint32_t n;
  
  i_00 = (uint32_t)((ulong)in_stack_ffffffffffffff50 >> 0x20);
  local_8 = in_RSI;
  if ((long)in_RDI < 0) {
    local_8 = in_RSI + 1;
    *in_RSI = '-';
    in_RDI = (Nonnull<char_*>)-(long)in_RDI;
  }
  p = in_RDI;
  out_str = in_RDI;
  pcVar4 = local_8;
  uVar2 = std::numeric_limits<unsigned_int>::max();
  n = (uint32_t)((ulong)pcVar4 >> 0x20);
  if ((Nonnull<char_*>)(ulong)uVar2 < p) {
    if (in_RDI < (Nonnull<char_*>)0x2386f26fc10000) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RDI;
      uVar2 = SUB164(auVar1 / ZEXT816(100000000),0);
      if (uVar2 < 10) {
        *local_8 = SUB161(auVar1 / ZEXT816(100000000),0) + '0';
        local_40 = local_8 + 1;
      }
      else if (uVar2 < 100000000) {
        uVar3 = anon_unknown_0::PrepareEightDigits(i_00);
        if (uVar3 == 0) {
          __assert_fail("bottom != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                        ,0xf4,
                        "absl::Nonnull<char *> absl::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                       );
        }
        uVar2 = countr_zero<unsigned_long>(uVar3);
        little_endian::Store64(p,in_stack_ffffffffffffff28);
        local_40 = local_8 + (8 - (ulong)(uVar2 >> 3));
      }
      else {
        anon_unknown_0::PrepareEightDigits(i_00);
        local_40 = anon_unknown_0::EncodeHundred(n,out_str);
        little_endian::Store64(p,in_stack_ffffffffffffff28);
        local_40 = local_40 + 8;
      }
      local_88 = local_40;
    }
    else {
      anon_unknown_0::PrepareEightDigits(i_00);
      local_88 = anon_unknown_0::EncodeTenThousand(n,out_str);
      little_endian::Store64(p,in_stack_ffffffffffffff28);
      local_88 = local_88 + 8;
    }
    anon_unknown_0::PrepareEightDigits(i_00);
    little_endian::Store64(p,in_stack_ffffffffffffff28);
    local_78 = local_88 + 8;
  }
  else {
    if ((uint)in_RDI < 10) {
      *local_8 = (char)in_RDI + '0';
      local_8 = local_8 + 1;
    }
    else if ((uint)in_RDI < 100000000) {
      uVar3 = anon_unknown_0::PrepareEightDigits(i_00);
      if (uVar3 == 0) {
        __assert_fail("bottom != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/numbers.cc"
                      ,0xf4,
                      "absl::Nonnull<char *> absl::(anonymous namespace)::EncodeFullU32(uint32_t, absl::Nonnull<char *>)"
                     );
      }
      uVar2 = countr_zero<unsigned_long>(uVar3);
      little_endian::Store64(p,in_stack_ffffffffffffff28);
      local_8 = local_8 + (8 - (ulong)(uVar2 >> 3));
    }
    else {
      anon_unknown_0::PrepareEightDigits(i_00);
      local_8 = anon_unknown_0::EncodeHundred(n,out_str);
      little_endian::Store64(p,in_stack_ffffffffffffff28);
      local_8 = local_8 + 8;
    }
    local_78 = local_8;
  }
  *local_78 = '\0';
  return local_78;
}

Assistant:

absl::Nonnull<char*> numbers_internal::FastIntToBuffer(
    int64_t i, absl::Nonnull<char*> buffer) {
  uint64_t u = static_cast<uint64_t>(i);
  if (i < 0) {
    *buffer++ = '-';
    // We need to do the negation in modular (i.e., "unsigned")
    // arithmetic; MSVC++ apparently warns for plain "-u", so
    // we write the equivalent expression "0 - u" instead.
    u = 0 - u;
  }
  buffer = EncodeFullU64(u, buffer);
  *buffer = '\0';
  return buffer;
}